

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenUtilsEM64T.hpp
# Opt level: O0

void Centaurus::emit_parser_epilog(X86Assembler *as,Label *rejectlabel)

{
  undefined4 in_stack_fffffffffffffee8;
  uint32_t in_stack_fffffffffffffeec;
  CodeEmitter *in_stack_fffffffffffffef0;
  Label acceptlabel;
  Label *rejectlabel_local;
  X86Assembler *as_local;
  undefined8 in_stack_ffffffffffffff18;
  uint32_t instId;
  CodeEmitter *in_stack_ffffffffffffff20;
  
  instId = (uint32_t)((ulong)in_stack_ffffffffffffff18 >> 0x20);
  (*(as->super_Assembler).super_CodeEmitter._vptr_CodeEmitter[7])(&stack0xfffffffffffffef0);
  asmjit::CodeEmitter::emit
            ((CodeEmitter *)rejectlabel,acceptlabel.super_Operand.super_Operand_.field_0._any.id,
             (Operand_ *)in_stack_fffffffffffffef0,
             (Operand_ *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  asmjit::CodeEmitter::emit
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffeec,(Operand_ *)0x16348a);
  (*(as->super_Assembler).super_CodeEmitter._vptr_CodeEmitter[9])(as,rejectlabel);
  rejectlabel_local._4_4_ = (int)((ulong)as >> 0x20);
  asmjit::CodeEmitter::emit
            (in_stack_ffffffffffffff20,instId,(Operand_ *)as_local,rejectlabel_local._4_4_);
  asmjit::CodeEmitter::emit
            ((CodeEmitter *)rejectlabel,acceptlabel.super_Operand.super_Operand_.field_0._any.id,
             (Operand_ *)in_stack_fffffffffffffef0,
             (Operand_ *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  (*(as->super_Assembler).super_CodeEmitter._vptr_CodeEmitter[9])(as,&stack0xfffffffffffffef0);
  asmjit::CodeEmitter::emit
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffeec,(Operand_ *)0x163573);
  asmjit::CodeEmitter::emit
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffeec,(Operand_ *)0x1635a1);
  asmjit::CodeEmitter::emit
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffeec,(Operand_ *)0x1635cf);
  asmjit::CodeEmitter::emit
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffeec,(Operand_ *)0x1635fd);
  asmjit::CodeEmitter::emit
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffeec,(Operand_ *)0x163631);
  asmjit::CodeEmitter::emit
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffeec,(Operand_ *)0x16366b);
  asmjit::CodeEmitter::emit
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffeec,(Operand_ *)0x1636a5);
  asmjit::CodeEmitter::emit
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffeec,(Operand_ *)0x1636df);
  asmjit::CodeEmitter::emit(in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
  return;
}

Assistant:

static void emit_parser_epilog(asmjit::X86Assembler& as, asmjit::Label& rejectlabel)
{
    asmjit::Label acceptlabel = as.newLabel();

    as.mov(asmjit::x86::rax, INPUT_REG);
    as.jmp(acceptlabel);

    //Jump to this label is a long jump. Discard everything on the stack.
    as.bind(rejectlabel);
    as.mov(asmjit::x86::rax, 0);
    as.mov(asmjit::x86::rsp, asmjit::x86::r9);

    as.bind(acceptlabel);

    as.pop(asmjit::x86::rbx);
    as.pop(asmjit::x86::rcx);
    as.pop(asmjit::x86::rdx);
    as.pop(asmjit::x86::rsi);
    as.pop(asmjit::x86::rdi);
    as.pop(asmjit::x86::rbp);
    as.pop(asmjit::x86::r8);
    as.pop(asmjit::x86::r9);

    as.ret();
}